

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_getsocket.c
# Opt level: O3

int os_fd_generic_getsocket
              (os_fd *sock,netaddr_socket *bind_to,_Bool tcp,size_t recvbuf,os_interface *os_if,
              oonf_log_source log_src)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined7 in_register_00000011;
  int iVar4;
  
  iVar4 = 0;
  iVar1 = socket((uint)(bind_to->v4).sin_family,2 - (int)CONCAT71(in_register_00000011,tcp),0);
  if (iVar1 < 0) {
    iVar4 = -1;
    if (((&log_global_mask)[log_src] & 4) != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      oonf_log(4,(ulong)log_src,"src/base/os_generic/os_fd_generic_getsocket.c",0x49,0,0,
               "Cannot open socket: %s (%d)",pcVar3,*piVar2);
    }
  }
  else {
    sock->fd = iVar1;
    sock->_flags = OS_FD_ACTIVE;
    iVar1 = os_fd_generic_configsocket(sock,bind_to,recvbuf,false,os_if,log_src);
    if (iVar1 != 0) {
      iVar4 = -1;
      if (sock->fd != -1) {
        close(sock->fd);
        sock->fd = -1;
      }
    }
  }
  return iVar4;
}

Assistant:

int
os_fd_generic_getsocket(struct os_fd *sock, const union netaddr_socket *bind_to, bool tcp, size_t recvbuf,
  const struct os_interface *os_if, enum oonf_log_source log_src __attribute__((unused))) {
  int s;
  s = socket(bind_to->std.sa_family, tcp ? SOCK_STREAM : SOCK_DGRAM, 0);
  if (s < 0) {
    OONF_WARN(log_src, "Cannot open socket: %s (%d)", strerror(errno), errno);
    return -1;
  }

  if (os_fd_init(sock, s)) {
    OONF_WARN(log_src, "Could not initialize socket");
    return -1;
  }

  if (os_fd_configsocket(sock, bind_to, recvbuf, false, os_if, log_src)) {
    os_fd_close(sock);
    return -1;
  }
  return 0;
}